

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O0

lws * lws_adopt_descriptor_vhost2(lws *new_wsi,lws_adoption_type type,lws_sock_file_fd_type fd)

{
  int iVar1;
  lws_callback_reasons local_34;
  int n;
  lws_context_per_thread *pt;
  lws_adoption_type type_local;
  lws *new_wsi_local;
  lws_sock_file_fd_type fd_local;
  
  pt._4_4_ = type;
  if ((type & LWS_ADOPT_SOCKET) == LWS_ADOPT_RAW_FILE_DESC) {
    iVar1 = lws_plat_set_nonblocking(fd.sockfd);
    if (iVar1 != 0) {
      _lws_log(1,"%s: unable to set filefd nonblocking\n","lws_adopt_descriptor_vhost2");
      goto LAB_00122409;
    }
  }
  else {
    iVar1 = lws_plat_set_nonblocking(fd.sockfd);
    if (iVar1 != 0) {
      _lws_log(1,"%s: unable to set sockfd %d nonblocking\n","lws_adopt_descriptor_vhost2",
               (ulong)(uint)fd.sockfd);
      goto LAB_00122409;
    }
  }
  new_wsi->desc = fd;
  if (((new_wsi->vhost == (lws_vhost *)0x0) || ((new_wsi->vhost->tls).use_ssl == 0)) ||
     ((type & LWS_ADOPT_SOCKET) == LWS_ADOPT_RAW_FILE_DESC)) {
    pt._4_4_ = type & ~LWS_ADOPT_ALLOW_SSL;
  }
  new_wsi->wsistate = new_wsi->wsistate | 0x20000000;
  local_34 = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
  if (new_wsi->role_ops->adoption_cb[(int)(uint)((new_wsi->wsistate & 0x20000000) != 0)] != 0) {
    local_34 = (lws_callback_reasons)
               new_wsi->role_ops->adoption_cb[(int)(uint)((new_wsi->wsistate & 0x20000000) != 0)];
  }
  if ((new_wsi->context->event_loop_ops->sock_accept == (_func_int_lws_ptr *)0x0) ||
     (iVar1 = (*new_wsi->context->event_loop_ops->sock_accept)(new_wsi), iVar1 == 0)) {
    if ((pt._4_4_ & LWS_ADOPT_ALLOW_SSL) == LWS_ADOPT_RAW_FILE_DESC) {
      iVar1 = __insert_wsi_socket_into_fds(new_wsi->context,new_wsi);
      if (iVar1 != 0) {
        _lws_log(1,"%s: fail inserting socket\n","lws_adopt_descriptor_vhost2");
        goto LAB_00122409;
      }
    }
    else {
      iVar1 = lws_server_socket_service_ssl(new_wsi,fd.sockfd);
      if (iVar1 != 0) {
        _lws_log(8,"%s: fail ssl negotiation\n","lws_adopt_descriptor_vhost2");
        goto LAB_00122409;
      }
    }
    lws_dll2_remove(&new_wsi->vh_awaiting_socket);
    iVar1 = (*new_wsi->protocol->callback)(new_wsi,local_34,new_wsi->user_space,(void *)0x0,0);
    if (iVar1 == 0) {
      lws_role_call_adoption_bind(new_wsi,pt._4_4_ | 0x1000000,new_wsi->protocol->name);
      lws_cancel_service_pt(new_wsi);
      return new_wsi;
    }
  }
LAB_00122409:
  if ((pt._4_4_ & LWS_ADOPT_SOCKET) != LWS_ADOPT_RAW_FILE_DESC) {
    lws_close_free_wsi(new_wsi,LWS_CLOSE_STATUS_NOSTATUS,"adopt skt fail");
  }
  return (lws *)0x0;
}

Assistant:

static struct lws *
lws_adopt_descriptor_vhost2(struct lws *new_wsi, lws_adoption_type type,
			    lws_sock_file_fd_type fd)
{
	struct lws_context_per_thread *pt =
			&new_wsi->context->pt[(int)new_wsi->tsi];
	int n;

	/* enforce that every fd is nonblocking */

	if (type & LWS_ADOPT_SOCKET) {
		if (lws_plat_set_nonblocking(fd.sockfd)) {
			lwsl_err("%s: unable to set sockfd %d nonblocking\n",
				 __func__, fd.sockfd);
			goto fail;
		}
	}
#if !defined(WIN32)
	else
		if (lws_plat_set_nonblocking(fd.filefd)) {
			lwsl_err("%s: unable to set filefd nonblocking\n",
				 __func__);
			goto fail;
		}
#endif

	new_wsi->desc = fd;

	if (!LWS_SSL_ENABLED(new_wsi->vhost) ||
	    !(type & LWS_ADOPT_SOCKET))
		type &= ~LWS_ADOPT_ALLOW_SSL;

	/*
	 * A new connection was accepted. Give the user a chance to
	 * set properties of the newly created wsi. There's no protocol
	 * selected yet so we issue this to the vhosts's default protocol,
	 * itself by default protocols[0]
	 */
	new_wsi->wsistate |= LWSIFR_SERVER;
	n = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
	if (new_wsi->role_ops->adoption_cb[lwsi_role_server(new_wsi)])
		n = new_wsi->role_ops->adoption_cb[lwsi_role_server(new_wsi)];

	if (new_wsi->context->event_loop_ops->sock_accept)
		if (new_wsi->context->event_loop_ops->sock_accept(new_wsi))
			goto fail;

#if LWS_MAX_SMP > 1
	/*
	 * Caution: after this point the wsi is live on its service thread
	 * which may be concurrent to this.  We mark the wsi as still undergoing
	 * init in another pt so the assigned pt leaves it alone.
	 */
	new_wsi->undergoing_init_from_other_pt = 1;
#endif

	if (!(type & LWS_ADOPT_ALLOW_SSL)) {
		lws_pt_lock(pt, __func__);
		if (__insert_wsi_socket_into_fds(new_wsi->context, new_wsi)) {
			lws_pt_unlock(pt);
			lwsl_err("%s: fail inserting socket\n", __func__);
			goto fail;
		}
		lws_pt_unlock(pt);
	}
#if defined(LWS_WITH_SERVER)
	 else
		if (lws_server_socket_service_ssl(new_wsi, fd.sockfd)) {
#if defined(LWS_WITH_ACCESS_LOG)
			lwsl_notice("%s: fail ssl negotiation: %s\n", __func__,
					new_wsi->simple_ip);
#else
			lwsl_info("%s: fail ssl negotiation\n", __func__);
#endif
			goto fail;
		}
#endif

	/* he has fds visibility now, remove from vhost orphan list */
	lws_dll2_remove(&new_wsi->vh_awaiting_socket);

	/*
	 *  by deferring callback to this point, after insertion to fds,
	 * lws_callback_on_writable() can work from the callback
	 */
	if ((new_wsi->protocol->callback)(new_wsi, n, new_wsi->user_space,
					  NULL, 0))
		goto fail;

	/* role may need to do something after all adoption completed */

	lws_role_call_adoption_bind(new_wsi, type | _LWS_ADOPT_FINISH,
				    new_wsi->protocol->name);

#if LWS_MAX_SMP > 1
	/* its actual pt can service it now */

	new_wsi->undergoing_init_from_other_pt = 0;
#endif

	lws_cancel_service_pt(new_wsi);

	return new_wsi;

fail:
	if (type & LWS_ADOPT_SOCKET)
		lws_close_free_wsi(new_wsi, LWS_CLOSE_STATUS_NOSTATUS,
				   "adopt skt fail");

	return NULL;
}